

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeHulls.cpp
# Opt level: O2

HaU32 __thiscall
HACD::MyMergeHullsInterface::mergeHulls
          (MyMergeHullsInterface *this,MergeHullVector *inputHulls,MergeHullVector *outputHulls,
          HaU32 mergeHullCount,HaF32 smallClusterThreshold,HaU32 maxHullVertices)

{
  undefined4 uVar1;
  undefined4 uVar2;
  HaU32 HVar3;
  HaU32 tcount;
  HaU32 vcount;
  HaF32 *vertices;
  HaU32 *indices;
  bool bVar4;
  SparseArray<float,_512UL> *pSVar5;
  MergeHull *pMVar6;
  ChUll *pCVar7;
  ChUll **ppCVar8;
  HaU32 i;
  uint uVar9;
  undefined1 auVar10 [16];
  ChUll *ch;
  HaF32 *local_40;
  HaU32 *pHStack_38;
  
  this->mGuid = 0;
  HVar3 = inputHulls->mSize;
  pSVar5 = (SparseArray<float,_512UL> *)malloc(0x1018);
  SparseArray<float,_512UL>::SparseArray(pSVar5,HVar3 * HVar3);
  this->mHasBeenTested = pSVar5;
  this->mSmallClusterThreshold = smallClusterThreshold;
  this->mMaxHullVertices = maxHullVertices;
  this->mMergeNumHulls = mergeHullCount;
  this->mTotalVolume = 0.0;
  for (uVar9 = 0; uVar9 < inputHulls->mSize; uVar9 = uVar9 + 1) {
    pMVar6 = hacd::vector<HACD::MergeHull>::operator[](inputHulls,uVar9);
    pCVar7 = (ChUll *)malloc(0x40);
    HVar3 = this->mGuid;
    vertices = pMVar6->mVertices;
    tcount = pMVar6->mTriangleCount;
    vcount = pMVar6->mVertexCount;
    indices = pMVar6->mIndices;
    this->mGuid = HVar3 + 1;
    ChUll::ChUll(pCVar7,vcount,vertices,tcount,indices,HVar3);
    ch = pCVar7;
    hacd::vector<HACD::ChUll_*>::push_back(&this->mChulls,&ch);
    this->mTotalVolume = (HaF32)((float)ch->mVolume + (float)this->mTotalVolume);
  }
  do {
    bVar4 = combineHulls(this);
  } while (bVar4);
  for (uVar9 = 0; uVar9 < (this->mChulls).mSize; uVar9 = uVar9 + 1) {
    ppCVar8 = hacd::vector<HACD::ChUll_*>::operator[](&this->mChulls,uVar9);
    pCVar7 = *ppCVar8;
    uVar1 = pCVar7->mVertexCount;
    uVar2 = pCVar7->mTriangleCount;
    auVar10._4_4_ = uVar2;
    auVar10._0_4_ = uVar1;
    auVar10._8_8_ = 0;
    auVar10 = vshufps_avx(auVar10,auVar10,0xe1);
    ch = (ChUll *)vmovlps_avx(auVar10);
    local_40 = pCVar7->mVertices;
    pHStack_38 = pCVar7->mIndices;
    hacd::vector<HACD::MergeHull>::push_back(outputHulls,(MergeHull *)&ch);
  }
  pSVar5 = this->mHasBeenTested;
  if (pSVar5 != (SparseArray<float,_512UL> *)0x0) {
    SparseArray<float,_512UL>::~SparseArray(pSVar5);
  }
  free(pSVar5);
  return outputHulls->mSize;
}

Assistant:

virtual hacd::HaU32 mergeHulls(const MergeHullVector &inputHulls,
		MergeHullVector &outputHulls,
		hacd::HaU32 mergeHullCount,
		hacd::HaF32 smallClusterThreshold,
		hacd::HaU32 maxHullVertices)
	{
		mGuid = 0;

		HaU32 count = (HaU32)inputHulls.size();
		mHasBeenTested = HACD_NEW(TestedMap)(count*count);
		mSmallClusterThreshold = smallClusterThreshold;
		mMaxHullVertices = maxHullVertices;
		mMergeNumHulls = mergeHullCount;

		mTotalVolume = 0;
		for (HaU32 i=0; i<inputHulls.size(); i++)
		{
			const MergeHull &h = inputHulls[i];
			ChUll *ch = HACD_NEW(ChUll)(h.mVertexCount,h.mVertices,h.mTriangleCount,h.mIndices,mGuid++);
			mChulls.push_back(ch);
			mTotalVolume+=ch->mVolume;
		}

		for(;;)
		{
			bool combined = combineHulls(); // mege smallest hulls first, up to the max merge count.
			if ( !combined ) break;
		} 

		// return results..
		for (HaU32 i=0; i<mChulls.size(); i++)
		{
			ChUll *ch = mChulls[i];
			MergeHull mh;
			mh.mVertexCount = ch->mVertexCount;
			mh.mTriangleCount = ch->mTriangleCount;
			mh.mIndices = ch->mIndices;
			mh.mVertices = ch->mVertices;
			outputHulls.push_back(mh);
		}
		delete mHasBeenTested;
		return (HaU32)outputHulls.size();
	}